

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall vera::Mesh::invertWindingOrder(Mesh *this)

{
  pointer puVar1;
  pointer puVar2;
  size_t i;
  ulong uVar3;
  
  if (this->m_drawMode == TRIANGLES) {
    puVar1 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (uVar3 = 0; uVar3 < (ulong)((long)puVar2 - (long)puVar1 >> 2); uVar3 = uVar3 + 3) {
      *(ulong *)(puVar1 + uVar3 + 1) =
           CONCAT44((int)*(undefined8 *)(puVar1 + uVar3 + 1),
                    (int)((ulong)*(undefined8 *)(puVar1 + uVar3 + 1) >> 0x20));
    }
  }
  return;
}

Assistant:

void Mesh::invertWindingOrder() {
    if ( getDrawMode() == TRIANGLES) {
        int tmp;
        for (size_t i = 0; i < m_indices.size(); i += 3) {
            tmp = m_indices[i+1];
            m_indices[i+1] = m_indices[i+2];
            m_indices[i+2] = tmp;
        }
    }
}